

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O0

void __thiscall
chatra::emb::io::WriteStandardFile::WriteStandardFile
          (WriteStandardFile *this,string *fileName,Type_conflict flags,FILE *fp,size_t length,
          bool append)

{
  int iVar1;
  string local_58;
  byte local_31;
  size_t sStack_30;
  bool append_local;
  size_t length_local;
  FILE *fp_local;
  string *psStack_18;
  Type_conflict flags_local;
  string *fileName_local;
  WriteStandardFile *this_local;
  
  local_31 = append;
  sStack_30 = length;
  length_local = (size_t)fp;
  fp_local._4_4_ = flags;
  psStack_18 = fileName;
  fileName_local = (string *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)fileName);
  StandardFileCommon::StandardFileCommon
            (&this->super_StandardFileCommon,&local_58,fp_local._4_4_,(FILE *)length_local,sStack_30
            );
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_StandardFileCommon).super_IFile._vptr_IFile =
       (_func_int **)&PTR__WriteStandardFile_0042eb88;
  if ((local_31 & 1) != 0) {
    (this->super_StandardFileCommon).current = sStack_30;
    iVar1 = fseek((FILE *)length_local,sStack_30,0);
    if (iVar1 != 0) {
      StandardFileCommon::doClose(&this->super_StandardFileCommon);
    }
  }
  return;
}

Assistant:

WriteStandardFile(std::string fileName, FileOpenFlags::Type flags,
			std::FILE* fp, size_t length, bool append) : StandardFileCommon(std::move(fileName), flags, fp, length) {
		if (append) {
			current = length;
			if (std::fseek(fp, static_cast<long>(length), SEEK_SET))
				doClose();
		}
	}